

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

bool __thiscall QTreeViewPrivate::expandOrCollapseItemAtPos(QTreeViewPrivate *this,QPoint *pos)

{
  State SVar1;
  long *plVar2;
  QWidgetData *pQVar3;
  char cVar4;
  bool bVar5;
  int item;
  bool bVar6;
  long in_FS_OFFSET;
  QPoint local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  SVar1 = (this->super_QAbstractItemViewPrivate).state;
  if ((SVar1 == EditingState) || (SVar1 == NoState)) {
    pQVar3 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_38 = CONCAT44((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i,
                        (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i);
    local_40.xp.m_i = 0;
    local_40.yp.m_i = 0;
    cVar4 = QRect::contains(&local_40,SUB81(pos,0));
    bVar6 = true;
    if (cVar4 != '\0') {
      item = itemDecorationAt(this,pos);
      if ((item != -1) && (this->itemsExpandable == true)) {
        bVar5 = hasVisibleChildren(this,&(this->viewItems).d.ptr[item].index);
        if (bVar5) {
          if (((this->viewItems).d.ptr[item].field_0x1c & 1) == 0) {
            expand(this,item,true);
          }
          else {
            collapse(this,item,true);
          }
          if ((this->super_QAbstractItemViewPrivate).state != AnimatingState) {
            (**(code **)(*plVar2 + 0x268))(plVar2);
            QWidget::update((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                            viewport);
          }
          goto LAB_005ac803;
        }
      }
      bVar6 = false;
    }
  }
  else {
    bVar6 = true;
  }
LAB_005ac803:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeViewPrivate::expandOrCollapseItemAtPos(const QPoint &pos)
{
    Q_Q(QTreeView);
    // we want to handle mousePress in EditingState (persistent editors)
    if ((state != QAbstractItemView::NoState
                && state != QAbstractItemView::EditingState)
                || !viewport->rect().contains(pos))
        return true;

    int i = itemDecorationAt(pos);
    if ((i != -1) && itemsExpandable && hasVisibleChildren(viewItems.at(i).index)) {
        if (viewItems.at(i).expanded)
            collapse(i, true);
        else
            expand(i, true);
        if (!isAnimating()) {
            q->updateGeometries();
            viewport->update();
        }
        return true;
    }
    return false;
}